

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> *
duckdb::ScalarFunctionExtractor::GetParameterLogicalTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  ScalarFunction fun;
  ScalarFunction local_130;
  
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            (&local_130,&(entry->functions).super_FunctionSet<duckdb::ScalarFunction>,offset);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_130.super_BaseScalarFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_130.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_130.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_130.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_130.function.super__Function_base._M_manager)
              ((_Any_data *)&local_130.function,(_Any_data *)&local_130.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_130.super_BaseScalarFunction);
  return __return_storage_ptr__;
}

Assistant:

static vector<LogicalType> GetParameterLogicalTypes(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return fun.arguments;
	}